

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

csubstr __thiscall c4::yml::Parser::_filter_dquot_scalar(Parser *this,substr s)

{
  char cVar1;
  code *pcVar2;
  Location LVar3;
  Location LVar4;
  substr r;
  substr r_00;
  substr dst;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  size_t sVar8;
  size_t sVar9;
  byte bVar10;
  int iVar11;
  uint32_t uVar12;
  char cVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  csubstr fmt;
  csubstr fmt_00;
  csubstr fmt_01;
  csubstr fmt_02;
  csubstr fmt_03;
  csubstr cVar17;
  substr sVar18;
  csubstr cVar19;
  size_t pos;
  char readbuf [8];
  size_t local_d8;
  size_t local_d0;
  basic_substring<char> local_c8;
  undefined7 uStack_b8;
  undefined1 uStack_b1;
  undefined2 uStack_b0;
  undefined5 local_ae;
  undefined1 uStack_a9;
  undefined2 uStack_a8;
  char acStack_a6 [22];
  basic_substring<char> local_90;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  local_90.str = s.str;
  lVar14 = 0;
  local_90.len = s.len;
  sVar8 = basic_substring<char>::first_of(&local_90,'\\',0);
  if (sVar8 != 0xffffffffffffffff) {
    lVar14 = 0;
    do {
      sVar8 = basic_substring<char>::first_of(&local_90,'\\',sVar8 + 1);
      lVar14 = lVar14 + 2;
    } while (sVar8 != 0xffffffffffffffff);
  }
  uVar15 = lVar14 + s.len;
  uVar16 = (this->m_filter_arena).len;
  if (uVar16 < uVar15) {
    uVar16 = uVar16 * 2;
    if (uVar16 <= uVar15) {
      uVar16 = uVar15;
    }
    sVar8 = 0x80;
    if (0x80 < uVar16) {
      sVar8 = uVar16;
    }
    _resize_filter_arena(this,sVar8);
  }
  sVar8 = local_90.len;
  pcVar5 = local_90.str;
  sVar18.len = local_90.len;
  sVar18.str = local_90.str;
  dst.len = local_90.len;
  dst.str = local_90.str;
  r_00.len = local_90.len;
  r_00.str = local_90.str;
  r.len = local_90.len;
  r.str = local_90.str;
  local_d8 = 0;
  local_d0 = 0;
  if (local_90.len == 0) {
    bVar7 = false;
  }
  else {
    bVar7 = false;
    do {
      bVar10 = pcVar5[local_d0];
      if (bVar10 < 0xd) {
        if (bVar10 == 9) {
LAB_001e0655:
          _filter_ws<true>(this,r_00,&local_d0,&local_d8);
        }
        else if (bVar10 == 10) {
          bVar7 = _filter_nl<true,true>(this,r,&local_d0,&local_d8,0);
        }
        else {
LAB_001e06c8:
          (this->m_filter_arena).str[local_d8] = bVar10;
          local_d8 = local_d8 + 1;
        }
        goto switchD_001e06a8_caseD_5d;
      }
      if (bVar10 == 0xd) goto switchD_001e06a8_caseD_5d;
      if (bVar10 != 0x5c) {
        if (bVar10 != 0x20) goto LAB_001e06c8;
        goto LAB_001e0655;
      }
      uVar16 = local_d0 + 1;
      bVar7 = true;
      if (sVar8 <= uVar16) goto switchD_001e06a8_caseD_5d;
      bVar10 = pcVar5[uVar16];
      if (bVar10 < 0x5c) {
        if (bVar10 < 0x2f) {
          if (bVar10 < 0xd) {
            uVar16 = local_d0;
            if (bVar10 == 9) {
LAB_001e07d8:
              (this->m_filter_arena).str[local_d8] = bVar10;
              local_d8 = local_d8 + 1;
              goto LAB_001e07f0;
            }
joined_r0x001e0784:
            if (bVar10 == 10) {
              uVar16 = uVar16 + 2;
              local_d0 = uVar16;
              if (uVar16 < sVar8) {
                do {
                  if ((pcVar5[uVar16] != ' ') && (local_d0 = uVar16, pcVar5[uVar16] != '\t')) break;
                  uVar16 = uVar16 + 1;
                  local_d0 = sVar8;
                } while (sVar8 != uVar16);
              }
              local_d0 = local_d0 - 1;
            }
          }
          else if (bVar10 == 0xd) {
            if (local_d0 + 2 < sVar8) {
              bVar10 = pcVar5[local_d0 + 2];
              goto joined_r0x001e0784;
            }
          }
          else if ((bVar10 == 0x20) || (bVar10 == 0x22)) goto LAB_001e07d8;
          goto switchD_001e06a8_caseD_5d;
        }
        switch(bVar10) {
        case 0x4c:
          (this->m_filter_arena).str[local_d8] = -0x1e;
          lVar14 = local_d8 + 2;
          (this->m_filter_arena).str[local_d8 + 1] = -0x80;
          local_d8 = local_d8 + 3;
          (this->m_filter_arena).str[lVar14] = -0x58;
          break;
        case 0x4d:
        case 0x4f:
        case 0x51:
        case 0x52:
        case 0x53:
        case 0x54:
          goto switchD_001e06a8_caseD_5d;
        case 0x4e:
          lVar14 = local_d8 + 1;
          (this->m_filter_arena).str[local_d8] = -0x3e;
          local_d8 = local_d8 + 2;
          (this->m_filter_arena).str[lVar14] = -0x7b;
          break;
        case 0x50:
          (this->m_filter_arena).str[local_d8] = -0x1e;
          lVar14 = local_d8 + 2;
          (this->m_filter_arena).str[local_d8 + 1] = -0x80;
          local_d8 = local_d8 + 3;
          (this->m_filter_arena).str[lVar14] = -0x57;
          break;
        case 0x55:
          if (sVar8 <= local_d0 + 9) {
            bVar7 = is_debugger_attached();
            if ((bVar7) && (bVar7 = is_debugger_attached(), bVar7)) {
              pcVar2 = (code *)swi(3);
              cVar17 = (csubstr)(*pcVar2)();
              return cVar17;
            }
            cVar17.len = 0x1f;
            cVar17.str = "ERROR: \\U requires 8 hex digits";
            _err<>(this,cVar17);
          }
          if (sVar8 < local_d0 + 2) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
              pcVar2 = (code *)swi(3);
              cVar17 = (csubstr)(*pcVar2)();
              return cVar17;
            }
            handle_error(0x1f7f77,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x153a,"first >= 0 && first <= len");
          }
          if (sVar8 < 8) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
              pcVar2 = (code *)swi(3);
              cVar17 = (csubstr)(*pcVar2)();
              return cVar17;
            }
            handle_error(0x1f7f77,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
          }
          if (sVar8 < local_d0 + 10) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
              pcVar2 = (code *)swi(3);
              cVar17 = (csubstr)(*pcVar2)();
              return cVar17;
            }
            handle_error(0x1f7f77,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
          }
          basic_substring<char>::basic_substring(&local_c8,pcVar5 + local_d0 + 2,8);
          if ((CONCAT17(local_c8.len._7_1_,(undefined7)local_c8.len) == 0) ||
             (local_c8.str == (char *)0x0)) {
            if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
              pcVar2 = (code *)swi(3);
              cVar17 = (csubstr)(*pcVar2)();
              return cVar17;
            }
            handle_error(0x1f7f77,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x2cac,"!s.empty()");
          }
          lVar14 = 0;
          uVar12 = 0;
          do {
            cVar13 = local_c8.str[lVar14];
            iVar11 = -0x30;
            if (((9 < (byte)(cVar13 - 0x30U)) && (iVar11 = -0x57, 5 < (byte)(cVar13 + 0x9fU))) &&
               (iVar11 = -0x37, 5 < (byte)(cVar13 + 0xbfU))) {
              bVar7 = is_debugger_attached();
              if ((bVar7) && (bVar7 = is_debugger_attached(), bVar7)) {
                pcVar2 = (code *)swi(3);
                cVar17 = (csubstr)(*pcVar2)();
                return cVar17;
              }
              fmt_03.len = 0x23;
              fmt_03.str = "ERROR: failed to parse \\U codepoint";
              _err<>(this,fmt_03);
              break;
            }
            uVar12 = uVar12 * 0x10 + iVar11 + (int)cVar13;
            lVar14 = lVar14 + 1;
          } while (CONCAT17(local_c8.len._7_1_,(undefined7)local_c8.len) != lVar14);
          sVar9 = decode_code_point((uint8_t *)&local_c8,8,uVar12);
          memcpy((this->m_filter_arena).str + local_d8,&local_c8,sVar9);
          local_d8 = local_d8 + sVar9;
          local_d0 = local_d0 + 9;
          goto LAB_001e0d4d;
        default:
          if (bVar10 == 0x2f) goto LAB_001e07d8;
          if (bVar10 == 0x30) {
            (this->m_filter_arena).str[local_d8] = '\0';
            local_d8 = local_d8 + 1;
            break;
          }
          goto switchD_001e06a8_caseD_5d;
        }
        goto LAB_001e07f0;
      }
      switch(bVar10) {
      case 0x5c:
        (this->m_filter_arena).str[local_d8] = '\\';
        local_d8 = local_d8 + 1;
        break;
      default:
        goto switchD_001e06a8_caseD_5d;
      case 0x5f:
        (this->m_filter_arena).str[local_d8] = -0x3e;
        (this->m_filter_arena).str[local_d8 + 1] = -0x60;
        local_d8 = local_d8 + 2;
        break;
      case 0x61:
        (this->m_filter_arena).str[local_d8] = '\a';
        local_d8 = local_d8 + 1;
        break;
      case 0x62:
        (this->m_filter_arena).str[local_d8] = '\b';
        local_d8 = local_d8 + 1;
        break;
      case 0x65:
        (this->m_filter_arena).str[local_d8] = '\x1b';
        local_d8 = local_d8 + 1;
        break;
      case 0x66:
        (this->m_filter_arena).str[local_d8] = '\f';
        local_d8 = local_d8 + 1;
        break;
      case 0x6e:
        (this->m_filter_arena).str[local_d8] = '\n';
        local_d8 = local_d8 + 1;
        break;
      case 0x72:
        (this->m_filter_arena).str[local_d8] = '\r';
        local_d8 = local_d8 + 1;
        break;
      case 0x74:
        (this->m_filter_arena).str[local_d8] = '\t';
        local_d8 = local_d8 + 1;
        break;
      case 0x75:
        if (sVar8 <= local_d0 + 5) {
          bVar7 = is_debugger_attached();
          if ((bVar7) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar2 = (code *)swi(3);
            cVar17 = (csubstr)(*pcVar2)();
            return cVar17;
          }
          fmt.len = 0x1f;
          fmt.str = "ERROR: \\u requires 4 hex digits";
          _err<>(this,fmt);
        }
        if (sVar8 < local_d0 + 2) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar2 = (code *)swi(3);
            cVar17 = (csubstr)(*pcVar2)();
            return cVar17;
          }
          handle_error(0x1f7f77,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x153a,"first >= 0 && first <= len");
        }
        if (sVar8 < 4) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar2 = (code *)swi(3);
            cVar17 = (csubstr)(*pcVar2)();
            return cVar17;
          }
          handle_error(0x1f7f77,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
        }
        if (sVar8 < local_d0 + 6) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar2 = (code *)swi(3);
            cVar17 = (csubstr)(*pcVar2)();
            return cVar17;
          }
          handle_error(0x1f7f77,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
        }
        basic_substring<char>::basic_substring(&local_c8,pcVar5 + local_d0 + 2,4);
        if ((CONCAT17(local_c8.len._7_1_,(undefined7)local_c8.len) == 0) ||
           (local_c8.str == (char *)0x0)) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar2 = (code *)swi(3);
            cVar17 = (csubstr)(*pcVar2)();
            return cVar17;
          }
          handle_error(0x1f7f77,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x2cac,"!s.empty()");
        }
        lVar14 = 0;
        uVar12 = 0;
        do {
          cVar13 = local_c8.str[lVar14];
          iVar11 = -0x30;
          if (((9 < (byte)(cVar13 - 0x30U)) && (iVar11 = -0x57, 5 < (byte)(cVar13 + 0x9fU))) &&
             (iVar11 = -0x37, 5 < (byte)(cVar13 + 0xbfU))) {
            bVar7 = is_debugger_attached();
            if ((bVar7) && (bVar7 = is_debugger_attached(), bVar7)) {
              pcVar2 = (code *)swi(3);
              cVar17 = (csubstr)(*pcVar2)();
              return cVar17;
            }
            fmt_01.len = 0x23;
            fmt_01.str = "ERROR: failed to parse \\u codepoint";
            _err<>(this,fmt_01);
            break;
          }
          uVar12 = uVar12 * 0x10 + iVar11 + (int)cVar13;
          lVar14 = lVar14 + 1;
        } while (CONCAT17(local_c8.len._7_1_,(undefined7)local_c8.len) != lVar14);
        sVar9 = decode_code_point((uint8_t *)&local_c8,8,uVar12);
        memcpy((this->m_filter_arena).str + local_d8,&local_c8,sVar9);
        local_d8 = local_d8 + sVar9;
        local_d0 = local_d0 + 5;
        goto LAB_001e0d4d;
      case 0x76:
        (this->m_filter_arena).str[local_d8] = '\v';
        local_d8 = local_d8 + 1;
        break;
      case 0x78:
        if (sVar8 <= local_d0 + 3) {
          bVar7 = is_debugger_attached();
          if ((bVar7) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar2 = (code *)swi(3);
            cVar17 = (csubstr)(*pcVar2)();
            return cVar17;
          }
          fmt_00.len = 0x1f;
          fmt_00.str = "ERROR: \\x requires 2 hex digits";
          _err<>(this,fmt_00);
        }
        if (sVar8 < local_d0 + 2) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar2 = (code *)swi(3);
            cVar17 = (csubstr)(*pcVar2)();
            return cVar17;
          }
          handle_error(0x1f7f77,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x153a,"first >= 0 && first <= len");
        }
        if (sVar8 < local_d0 + 4) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar2 = (code *)swi(3);
            cVar17 = (csubstr)(*pcVar2)();
            return cVar17;
          }
          handle_error(0x1f7f77,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
        }
        basic_substring<char>::basic_substring(&local_c8,pcVar5 + local_d0 + 2,2);
        if ((CONCAT17(local_c8.len._7_1_,(undefined7)local_c8.len) == 0) ||
           (local_c8.str == (char *)0x0)) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
            pcVar2 = (code *)swi(3);
            cVar17 = (csubstr)(*pcVar2)();
            return cVar17;
          }
          handle_error(0x1f7f77,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x2cac,"!s.empty()");
        }
        lVar14 = 0;
        cVar13 = '\0';
        do {
          cVar1 = local_c8.str[lVar14];
          bVar10 = cVar1 - 0x30;
          if (9 < bVar10) {
            if ((byte)(cVar1 + 0x9fU) < 6) {
              bVar10 = cVar1 + 0xa9;
            }
            else {
              if (5 < (byte)(cVar1 + 0xbfU)) {
                bVar7 = is_debugger_attached();
                if ((bVar7) && (bVar7 = is_debugger_attached(), bVar7)) {
                  pcVar2 = (code *)swi(3);
                  cVar17 = (csubstr)(*pcVar2)();
                  return cVar17;
                }
                fmt_02.len = 0x22;
                fmt_02.str = "ERROR: failed to read \\x codepoint";
                _err<>(this,fmt_02);
                break;
              }
              bVar10 = cVar1 - 0x37;
            }
          }
          cVar13 = cVar13 * '\x10' + bVar10;
          lVar14 = lVar14 + 1;
        } while (CONCAT17(local_c8.len._7_1_,(undefined7)local_c8.len) != lVar14);
        (this->m_filter_arena).str[local_d8] = cVar13;
        local_d0 = local_d0 + 3;
        local_d8 = local_d8 + 1;
LAB_001e0d4d:
        bVar7 = true;
        goto switchD_001e06a8_caseD_5d;
      }
LAB_001e07f0:
      local_d0 = local_d0 + 1;
switchD_001e06a8_caseD_5d:
      local_d0 = local_d0 + 1;
    } while (local_d0 < sVar8);
    if ((this->m_filter_arena).len < local_d8) {
      uStack_a8 = 0x6572;
      builtin_strncpy(acStack_a6,"na.len)",8);
      uStack_b8 = 0x6d203d3c20736f;
      uStack_b1 = 0x5f;
      uStack_b0 = 0x6966;
      local_ae = 0x5f7265746c;
      uStack_a9 = 0x61;
      local_c8.str = (char *)0x6166206b63656863;
      local_c8.len._0_7_ = 0x28203a64656c69;
      local_c8.len._7_1_ = 0x70;
      if ((((byte)s_error_flags & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar2 = (code *)swi(3);
        cVar17 = (csubstr)(*pcVar2)();
        return cVar17;
      }
      local_58 = 0;
      uStack_50 = 0x7d53;
      local_48 = 0;
      pcStack_40 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_38 = 0x65;
      LVar3.super_LineCol.col = 0;
      LVar3.super_LineCol.offset = SUB168(ZEXT816(0x7d53) << 0x40,0);
      LVar3.super_LineCol.line = SUB168(ZEXT816(0x7d53) << 0x40,8);
      LVar3.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar3.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                ((char *)&local_c8,0x2a,LVar3,(this->m_stack).m_callbacks.m_user_data);
    }
  }
  if ((local_d8 < sVar8) || (bVar7 != false)) {
    sVar18 = _finish_filter_arena(this,dst,local_d8);
  }
  if (local_90.len < sVar18.len) {
    uStack_b8 = 0x3d3e206e656c2e;
    uStack_b1 = 0x20;
    uStack_b0 = 0x2e72;
    local_ae = 0x296e656c;
    local_c8.str = (char *)0x6166206b63656863;
    local_c8.len._0_7_ = 0x28203a64656c69;
    local_c8.len._7_1_ = 0x73;
    if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar2 = (code *)swi(3);
      cVar17 = (csubstr)(*pcVar2)();
      return cVar17;
    }
    local_80 = 0;
    uStack_78 = 0x7d59;
    local_70 = 0;
    pcStack_68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_60 = 0x65;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x7d59) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x7d59) << 0x40,8);
    LVar4.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar4.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_c8,0x1f,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  cVar19.str = sVar18.str;
  cVar19.len = sVar18.len;
  return cVar19;
}

Assistant:

csubstr Parser::_filter_dquot_scalar(substr s)
{
    // a debugging scaffold:
    #if 0
    #define _c4dbgfdq(...) _c4dbgpf("filt_dquo_scalar" __VA_ARGS__)
    #else
    #define _c4dbgfdq(...)
    #endif

    _c4dbgfdq(": before=~~~{}~~~", s);

    // from the YAML spec for double-quoted scalars:
    // https://yaml.org/spec/1.2-old/spec.html#style/flow/double-quoted
    //
    // All leading and trailing white space characters are excluded
    // from the content. Each continuation line must therefore contain
    // at least one non-space character. Empty lines, if any, are
    // consumed as part of the line folding.

    _grow_filter_arena(s.len + 2u * s.count('\\'));
    substr r = s;
    size_t pos = 0; // the filtered size
    bool filtered_chars = false;
    for(size_t i = 0; i < r.len; ++i)
    {
        const char curr = r[i];
        _c4dbgfdq("[{}]: '{}'", i, _c4prc(curr));
        if(curr == ' ' || curr == '\t')
        {
            _filter_ws</*keep_trailing_ws*/true>(r, &i, &pos);
        }
        else if(curr == '\n')
        {
            filtered_chars = _filter_nl</*backslash_is_escape*/true, /*keep_trailing_ws*/true>(r, &i, &pos, /*indentation*/0);
        }
        else if(curr == '\r')  // skip \r --- https://stackoverflow.com/questions/1885900
        {
            ;
        }
        else if(curr == '\\')
        {
            char next = i+1 < r.len ? r[i+1] : '\0';
            _c4dbgfdq("[{}]: backslash, next='{}'", i, _c4prc(next));
            filtered_chars = true;
            if(next == '\r')
            {
                if(i+2 < r.len && r[i+2] == '\n')
                {
                    ++i; // newline escaped with \ -- skip both (add only one as i is loop-incremented)
                    next = '\n';
                    _c4dbgfdq("[{}]: was \\r\\n, now next='\\n'", i);
                }
            }
            // remember the loop will also increment i
            if(next == '\n')
            {
                size_t ii = i + 2;
                for( ; ii < r.len; ++ii)
                {
                    if(r.str[ii] == ' ' || r.str[ii] == '\t')  // skip leading whitespace
                        ;
                    else
                        break;
                }
                i += ii - i - 1;
            }
            else if(next == '"' || next == '/'  || next == ' ' || next == '\t') // escapes for json compatibility
            {
                m_filter_arena.str[pos++] = next;
                ++i;
            }
            else if(next == '\r')
            {
                //++i;
            }
            else if(next == 'n')
            {
                m_filter_arena.str[pos++] = '\n';
                ++i;
            }
            else if(next == 'r')
            {
                m_filter_arena.str[pos++] = '\r';
                ++i; // skip
            }
            else if(next == 't')
            {
                m_filter_arena.str[pos++] = '\t';
                ++i;
            }
            else if(next == '\\')
            {
                m_filter_arena.str[pos++] = '\\';
                ++i;
            }
            else if(next == 'x') // UTF8
            {
                if(i + 1u + 2u >= r.len)
                    _c4err("\\x requires 2 hex digits");
                uint8_t byteval = {};
                if(!read_hex(r.sub(i + 2u, 2u), &byteval))
                    _c4err("failed to read \\x codepoint");
                m_filter_arena.str[pos++] = *(char*)&byteval;
                i += 1u + 2u;
            }
            else if(next == 'u') // UTF16
            {
                if(i + 1u + 4u >= r.len)
                    _c4err("\\u requires 4 hex digits");
                char readbuf[8];
                csubstr codepoint = r.sub(i + 2u, 4u);
                uint32_t codepoint_val = {};
                if(!read_hex(codepoint, &codepoint_val))
                    _c4err("failed to parse \\u codepoint");
                size_t numbytes = decode_code_point((uint8_t*)readbuf, sizeof(readbuf), codepoint_val);
                C4_ASSERT(numbytes <= 4);
                memcpy(m_filter_arena.str + pos, readbuf, numbytes);
                pos += numbytes;
                i += 1u + 4u;
            }
            else if(next == 'U') // UTF32
            {
                if(i + 1u + 8u >= r.len)
                    _c4err("\\U requires 8 hex digits");
                char readbuf[8];
                csubstr codepoint = r.sub(i + 2u, 8u);
                uint32_t codepoint_val = {};
                if(!read_hex(codepoint, &codepoint_val))
                    _c4err("failed to parse \\U codepoint");
                size_t numbytes = decode_code_point((uint8_t*)readbuf, sizeof(readbuf), codepoint_val);
                C4_ASSERT(numbytes <= 4);
                memcpy(m_filter_arena.str + pos, readbuf, numbytes);
                pos += numbytes;
                i += 1u + 8u;
            }
            // https://yaml.org/spec/1.2.2/#rule-c-ns-esc-char
            else if(next == '0')
            {
                m_filter_arena.str[pos++] = '\0';
                ++i;
            }
            else if(next == 'b') // backspace
            {
                m_filter_arena.str[pos++] = '\b';
                ++i;
            }
            else if(next == 'f') // form feed
            {
                m_filter_arena.str[pos++] = '\f';
                ++i;
            }
            else if(next == 'a') // bell character
            {
                m_filter_arena.str[pos++] = '\a';
                ++i;
            }
            else if(next == 'v') // vertical tab
            {
                m_filter_arena.str[pos++] = '\v';
                ++i;
            }
            else if(next == 'e') // escape character
            {
                m_filter_arena.str[pos++] = '\x1b';
                ++i;
            }
            else if(next == '_') // unicode non breaking space \u00a0
            {
                // https://www.compart.com/en/unicode/U+00a0
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x3e, 0xc2);
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x60, 0xa0);
                ++i;
            }
            else if(next == 'N') // unicode next line \u0085
            {
                // https://www.compart.com/en/unicode/U+0085
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x3e, 0xc2);
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x7b, 0x85);
                ++i;
            }
            else if(next == 'L') // unicode line separator \u2028
            {
                // https://www.utf8-chartable.de/unicode-utf8-table.pl?start=8192&number=1024&names=-&utf8=0x&unicodeinhtml=hex
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x1e, 0xe2);
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x80, 0x80);
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x58, 0xa8);
                ++i;
            }
            else if(next == 'P') // unicode paragraph separator \u2029
            {
                // https://www.utf8-chartable.de/unicode-utf8-table.pl?start=8192&number=1024&names=-&utf8=0x&unicodeinhtml=hex
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x1e, 0xe2);
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x80, 0x80);
                m_filter_arena.str[pos++] = _RYML_CHCONST(-0x57, 0xa9);
                ++i;
            }
            _c4dbgfdq("[{}]: backslash...sofar=[{}]~~~{}~~~", i, pos, m_filter_arena.first(pos));
        }
        else
        {
            m_filter_arena.str[pos++] = curr;
        }
    }

    _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= m_filter_arena.len);
    if(pos < r.len || filtered_chars)
    {
        r = _finish_filter_arena(r, pos);
    }

    _RYML_CB_ASSERT(m_stack.m_callbacks, s.len >= r.len);
    _c4dbgpf(": #filteredchars={} after=~~~{}~~~", s.len - r.len, r);

    #undef _c4dbgfdq

    return r;
}